

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

bool spvOpcodeIsBaseOpaqueType(Op opcode)

{
  if ((((OpTypeForwardPointer < opcode) || ((0xfc8e000000U >> ((ulong)opcode & 0x3f) & 1) == 0)) &&
      (opcode != OpTypePipeStorage)) && (opcode != OpTypeNamedBarrier)) {
    return false;
  }
  return true;
}

Assistant:

bool spvOpcodeIsBaseOpaqueType(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeOpaque:
    case spv::Op::OpTypeEvent:
    case spv::Op::OpTypeDeviceEvent:
    case spv::Op::OpTypeReserveId:
    case spv::Op::OpTypeQueue:
    case spv::Op::OpTypePipe:
    case spv::Op::OpTypeForwardPointer:
    case spv::Op::OpTypePipeStorage:
    case spv::Op::OpTypeNamedBarrier:
      return true;
    default:
      return false;
  }
}